

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O1

qreal __thiscall
KDReports::SpreadsheetReportLayout::paintTableVerticalHeader
          (SpreadsheetReportLayout *this,qreal x,qreal y,QPainter *painter,int row)

{
  QAbstractItemModel *pQVar1;
  undefined8 uVar2;
  bool bVar3;
  Alignment alignment;
  QMetaType QVar4;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  QVariant cellDecoration;
  QVariant decorationAlignment;
  QRectF cellRect;
  QString cellText;
  QRectF cellContentsRect;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  anon_union_24_3_e3d07ef4_for_data local_f0;
  byte local_d8;
  qreal local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined2 local_bc;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  QRectF local_98;
  double local_78;
  QArrayDataPointer<char16_t> local_70;
  QColor local_58;
  QRectF local_48;
  
  pQVar1 = (this->m_tableLayout).m_model;
  local_98.h = (this->m_tableLayout).m_rowHeight;
  local_98.w = (this->m_tableLayout).m_vHeaderWidth;
  local_d0 = x;
  local_98.xp = x;
  local_98.yp = y;
  QFont::QFont((QFont *)local_f0.data,&(this->m_tableLayout).m_verticalHeaderFontScaler.m_font);
  QPainter::setFont((QFont *)painter);
  QFont::~QFont((QFont *)local_f0.data);
  QPainter::fillRect((QRectF *)painter,(QBrush *)&local_98);
  drawBorder(this,&local_98,painter);
  paVar5 = &local_f0;
  (**(code **)(*(long *)pQVar1 + 0xa0))(paVar5,pQVar1,row,2,9);
  QVar4.d_ptr._4_4_ = in_stack_ffffffffffffff0c;
  QVar4.d_ptr._0_4_ = in_stack_ffffffffffffff08;
  bVar3 = operator==(QVar4,(QMetaType)0x151c75);
  if (bVar3) {
    if ((local_d8 & 1) != 0) {
      paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_f0.shared + *(int *)(local_f0.shared + 4));
    }
    uVar2 = *(undefined8 *)paVar5;
    local_b8._0_4_ = (undefined4)uVar2;
    local_b8._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
    local_b8._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
    local_b8._8_6_ = (undefined6)*(undefined8 *)(paVar5->data + 8);
    local_b8._14_2_ = (undefined2)((ulong)*(undefined8 *)(paVar5->data + 8) >> 0x30);
  }
  else {
    local_b8._0_4_ = 0;
    local_b8._4_2_ = 0xffff;
    local_b8._6_2_ = 0;
    local_b8._8_6_ = 0;
    paVar5 = &local_f0;
    QVar4.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if ((local_d8 & 1) != 0) {
      paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_f0.shared + *(int *)(local_f0.shared + 4));
    }
    QMetaType::convert(QVar4,paVar5,(QMetaType)0x177160,&local_b8);
  }
  local_c8 = CONCAT26(local_b8._6_2_,CONCAT24(local_b8._4_2_,local_b8._0_4_));
  local_c0 = (undefined4)local_b8._8_6_;
  local_bc = (undefined2)((uint6)local_b8._8_6_ >> 0x20);
  QVariant::~QVariant((QVariant *)&local_f0);
  if ((int)local_c8 != 0) {
    QPainter::setPen((QColor *)painter);
  }
  (**(code **)(*(long *)pQVar1 + 0xa0))(&local_f0,pQVar1,row,2,0);
  QVariant::toString();
  QVariant::~QVariant((QVariant *)&local_f0);
  local_78 = (this->m_tableLayout).m_cellPadding *
             (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
  (**(code **)(*(long *)pQVar1 + 0xa0))(&local_f0,pQVar1,row,2,7);
  alignment.i = QVariant::toInt((bool *)local_f0.data);
  QVariant::~QVariant((QVariant *)&local_f0);
  (**(code **)(*(long *)pQVar1 + 0xa0))(&local_f0,pQVar1,row,2,1);
  (**(code **)(*(long *)pQVar1 + 0xa0))(&local_b8,pQVar1,row,2,0x2d535fb1);
  local_48.xp = local_98.xp + local_78;
  local_48.yp = local_98.yp + local_78;
  local_48.w = (local_98.w - local_78) - local_78;
  local_48.h = (local_98.h - local_78) - local_78;
  paintTextAndIcon(this,painter,&local_48,(QString *)&local_70,(QVariant *)&local_f0,
                   (QVariant *)&local_b8,alignment);
  if ((int)local_c8 != 0) {
    QColor::QColor(&local_58,black);
    QPainter::setPen((QColor *)painter);
  }
  local_d0 = local_d0 + local_98.w;
  QVariant::~QVariant((QVariant *)&local_b8);
  QVariant::~QVariant((QVariant *)&local_f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  return local_d0;
}

Assistant:

qreal KDReports::SpreadsheetReportLayout::paintTableVerticalHeader(qreal x, qreal y, QPainter &painter, int row)
{
    QAbstractItemModel *model = m_tableLayout.m_model;

    const QRectF cellRect(x, y, m_tableLayout.vHeaderWidth(), m_tableLayout.rowHeight());

    painter.setFont(m_tableLayout.verticalHeaderScaledFont());
    painter.fillRect(cellRect, m_tableSettings.m_headerBackground);
    drawBorder(cellRect, painter);

    const QColor foreground = qvariant_cast<QColor>(model->headerData(row, Qt::Vertical, Qt::ForegroundRole));
    if (foreground.isValid())
        painter.setPen(foreground);

    const QString cellText = model->headerData(row, Qt::Vertical).toString();
    const qreal padding = m_tableLayout.scaledCellPadding();
    const Qt::Alignment alignment(model->headerData(row, Qt::Vertical, Qt::TextAlignmentRole).toInt());
    const QVariant cellDecoration = model->headerData(row, Qt::Vertical, Qt::DecorationRole);
    const QVariant decorationAlignment = model->headerData(row, Qt::Vertical, KDReports::AutoTableElement::DecorationAlignmentRole);

    const QRectF cellContentsRect = cellRect.adjusted(padding, padding, -padding, -padding);
    // painter.drawText( cellContentsRect, alignment, cellText );
    paintTextAndIcon(painter, cellContentsRect, cellText, cellDecoration, decorationAlignment, alignment);

    if (foreground.isValid())
        painter.setPen(Qt::black);

    x += cellRect.width();
    return x;
}